

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O1

int nn_surveyor_create(void *hint,nn_sockbase **sockbase)

{
  nn_xsurveyor *self;
  nn_xsurveyor *self_00;
  nn_ctx *ctx;
  
  self_00 = (nn_xsurveyor *)nn_alloc_(0x360);
  if (self_00 != (nn_xsurveyor *)0x0) {
    nn_xsurveyor_init(self_00,&nn_surveyor_sockbase_vfptr,hint);
    self = self_00 + 1;
    ctx = nn_sockbase_getctx((nn_sockbase *)self_00);
    nn_fsm_init_root((nn_fsm *)self,nn_surveyor_handler,nn_surveyor_shutdown,ctx);
    *(undefined4 *)&self_00[1].inpipes.priolist.slots[2].pipes.first = 1;
    nn_random_generate((void *)((long)&self_00[1].inpipes.priolist.slots[2].pipes.first + 4),4);
    nn_timer_init((nn_timer *)&self_00[1].inpipes.priolist.slots[2].pipes.last,1,(nn_fsm *)self);
    nn_msg_init((nn_msg *)(self_00[1].inpipes.priolist.slots + 0xc),0);
    *(undefined8 *)&self_00[1].inpipes.priolist.current = 1000;
    nn_fsm_start((nn_fsm *)self);
    *sockbase = (nn_sockbase *)self_00;
    return 0;
  }
  nn_surveyor_create_cold_1();
}

Assistant:

static int nn_surveyor_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_surveyor *self;

    self = nn_alloc (sizeof (struct nn_surveyor), "socket (surveyor)");
    alloc_assert (self);
    nn_surveyor_init (self, &nn_surveyor_sockbase_vfptr, hint);
    *sockbase = &self->xsurveyor.sockbase;

    return 0;
}